

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

String * __thiscall
glcts::LayoutBindingBaseCase::initDefaultVSContext_abi_cxx11_
          (String *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  bool bVar1;
  int iVar2;
  mapped_type *ppcVar3;
  mapped_type *this_00;
  char *pcVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  mapped_type *pmVar6;
  StringStream s;
  key_type kStack_1e8;
  allocator<char> local_1c5;
  key_type local_1c4;
  key_type local_1c0;
  StringStream local_1a0;
  
  local_1a0.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
  _vptr_basic_ostream._0_4_ = 0;
  ppcVar3 = std::
            map<glcts::eStageType,_const_char_*,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_const_char_*>_>_>
            ::operator[](&this->m_templates,(key_type *)&local_1a0);
  *ppcVar3 = 
  "${VERSION}layout(location=0) in vec2 inPosition;\n${UNIFORM_DECL}\nflat out ${OUT_VAR_TYPE} fragColor;\n${OPTIONAL_FUNCTION_BLOCK}\nvoid main(void)\n{\n  ${OUT_ASSIGNMENT} ${UNIFORM_ACCESS}\n  gl_Position = vec4(inPosition, 0.0, 1.0);\n}\n"
  ;
  local_1a0.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
  _vptr_basic_ostream._0_4_ = 0;
  this_00 = std::
            map<glcts::eStageType,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ::operator[](&this->m_templateParams,(key_type *)&local_1a0);
  StringStream::StringStream(&local_1a0);
  pcVar4 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
  poVar5 = std::operator<<((ostream *)&local_1a0,pcVar4);
  std::operator<<(poVar5,"\n");
  std::operator<<((ostream *)&local_1a0,"precision highp float;\n");
  bVar1 = needsPrecision(this);
  if (bVar1) {
    poVar5 = std::operator<<((ostream *)&local_1a0,"precision highp ");
    iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    poVar5 = std::operator<<(poVar5,*(char **)(CONCAT44(extraout_var,iVar2) + 0x18));
    std::operator<<(poVar5,";\n");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"VERSION",(allocator<char> *)&local_1c4);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c0);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&kStack_1e8);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&kStack_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_1e8,"UNIFORM_DECL",(allocator<char> *)&local_1c0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&kStack_1e8);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&kStack_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_1e8,"OPTIONAL_FUNCTION_BLOCK",(allocator<char> *)&local_1c0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&kStack_1e8);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&kStack_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_1e8,"UNIFORM_ACCESS",(allocator<char> *)&local_1c0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&kStack_1e8);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&kStack_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_1e8,"OUT_ASSIGNMENT",(allocator<char> *)&local_1c0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&kStack_1e8);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&kStack_1e8);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_1e8,"OUT_VAR_TYPE",(allocator<char> *)&local_1c0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&kStack_1e8);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&kStack_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_1e8,"OUT_VAR",(allocator<char> *)&local_1c0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&kStack_1e8);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&kStack_1e8);
  if ((this->m_stage).type != VertexShader) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_1e8,"OUT_ASSIGNMENT",(allocator<char> *)&local_1c0);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&kStack_1e8);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&kStack_1e8);
  }
  local_1c4 = VertexShader;
  ppcVar3 = std::
            map<glcts::eStageType,_const_char_*,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_const_char_*>_>_>
            ::operator[](&this->m_templates,&local_1c4);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,*ppcVar3,&local_1c5);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&kStack_1e8,&local_1c0);
  tcu::StringTemplate::specialize(__return_storage_ptr__,(StringTemplate *)&kStack_1e8,this_00);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&kStack_1e8);
  std::__cxx11::string::~string((string *)&local_1c0);
  StringStream::~StringStream(&local_1a0);
  return __return_storage_ptr__;
}

Assistant:

String initDefaultVSContext()
	{
		m_templates[VertexShader] = "${VERSION}"
									"layout(location=0) in vec2 inPosition;\n"
									"${UNIFORM_DECL}\n"
									"flat out ${OUT_VAR_TYPE} fragColor;\n"
									"${OPTIONAL_FUNCTION_BLOCK}\n"
									"void main(void)\n"
									"{\n"
									"  ${OUT_ASSIGNMENT} ${UNIFORM_ACCESS}\n"
									"  gl_Position = vec4(inPosition, 0.0, 1.0);\n"
									"}\n";

		StringMap& args = m_templateParams[VertexShader];
		// some samplers and all images don't have default precision qualifier (sampler3D)
		// so append a precision default in all sampler and image cases.
		StringStream s;
		s << glu::getGLSLVersionDeclaration(m_glslVersion) << "\n";
		s << "precision highp float;\n";
		if (needsPrecision())
		{
			s << "precision highp " << getTestParameters().uniform_type << ";\n";
		}

		args["VERSION"]					= s.str();
		args["UNIFORM_DECL"]			= "";
		args["OPTIONAL_FUNCTION_BLOCK"] = "";
		args["UNIFORM_ACCESS"]			= "";
		args["OUT_ASSIGNMENT"]			= "fragColor =";
		args["OUT_VAR_TYPE"]			= getTestParameters().vector_type;
		args["OUT_VAR"]					= "fragColor";
		if (m_stage.type != VertexShader)
		{
			args["OUT_ASSIGNMENT"] = "";
		}
		return tcu::StringTemplate(m_templates[VertexShader]).specialize(args);
	}